

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_add_golas_heart.cpp
# Opt level: O0

void add_func_reinforce_room_9_spikeballs(ROM *rom,Map *map)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::DataRegister> __l_02;
  size_t this;
  uint32_t addr;
  vector<Entity_*,_std::allocator<Entity_*>_> *this_00;
  size_type sVar1;
  allocator<char> local_279;
  string local_278;
  allocator<md::AddressRegister> local_251;
  AddressRegister local_250;
  iterator local_240;
  size_type local_238;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_230;
  allocator<md::DataRegister> local_211;
  DataRegister local_210;
  iterator local_200;
  size_type local_1f8;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_1f0;
  allocator<char> local_1d1;
  string local_1d0;
  DataRegister local_1b0;
  AddressRegister local_1a0;
  AddressRegister local_190;
  AddressInRegister local_180;
  allocator<char> local_159;
  string local_158;
  AddressRegister local_138;
  DataRegister local_128;
  allocator<md::AddressRegister> local_111;
  AddressRegister local_110;
  iterator local_100;
  size_type local_f8;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_f0;
  allocator<md::DataRegister> local_d5 [13];
  DataRegister local_c8;
  iterator local_b8;
  size_type local_b0;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_a8;
  undefined1 local_90 [8];
  Code func_init_map;
  Map *map_local;
  ROM *rom_local;
  
  func_init_map._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)map;
  md::Code::Code((Code *)local_90);
  md::DataRegister::DataRegister(&local_c8,'\0');
  local_b8 = &local_c8;
  local_b0 = 1;
  std::allocator<md::DataRegister>::allocator(local_d5);
  __l_02._M_len = local_b0;
  __l_02._M_array = local_b8;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_a8,__l_02,local_d5);
  md::AddressRegister::AddressRegister(&local_110,'\0');
  local_100 = &local_110;
  local_f8 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_111);
  __l_01._M_len = local_f8;
  __l_01._M_array = local_100;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_f0,__l_01,&local_111);
  md::Code::movem_to_stack((Code *)local_90,&local_a8,&local_f0);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_f0);
  std::allocator<md::AddressRegister>::~allocator(&local_111);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_a8);
  std::allocator<md::DataRegister>::~allocator(local_d5);
  this_00 = Map::entities((Map *)func_init_map._labels._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
  sVar1 = std::vector<Entity_*,_std::allocator<Entity_*>_>::size(this_00);
  md::DataRegister::DataRegister(&local_128,'\0');
  md::Code::movel((Code *)local_90,(int)sVar1 - 1,(Param *)&local_128);
  md::AddressRegister::AddressRegister(&local_138,'\0');
  md::Code::lea((Code *)local_90,0xff5500,&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"loop_entities",&local_159);
  md::Code::label((Code *)local_90,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  md::AddressRegister::AddressRegister(&local_190,'\0');
  addr_<int>(&local_180,&local_190,0x3c);
  md::Code::moveb((Code *)local_90,0xa0,&local_180.super_Param);
  md::AddressRegister::AddressRegister(&local_1a0,'\0');
  md::Code::adda((Code *)local_90,0x80,&local_1a0);
  md::DataRegister::DataRegister(&local_1b0,'\0');
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"loop_entities",&local_1d1);
  md::Code::dbra((Code *)local_90,&local_1b0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  md::DataRegister::DataRegister(&local_210,'\0');
  local_200 = &local_210;
  local_1f8 = 1;
  std::allocator<md::DataRegister>::allocator(&local_211);
  __l_00._M_len = local_1f8;
  __l_00._M_array = local_200;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_1f0,__l_00,&local_211);
  md::AddressRegister::AddressRegister(&local_250,'\0');
  local_240 = &local_250;
  local_238 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_251);
  __l._M_len = local_238;
  __l._M_array = local_240;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_230,__l,&local_251);
  md::Code::movem_from_stack((Code *)local_90,&local_1f0,&local_230);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_230);
  std::allocator<md::AddressRegister>::~allocator(&local_251);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_1f0);
  std::allocator<md::DataRegister>::~allocator(&local_211);
  md::Code::rts((Code *)local_90);
  this = func_init_map._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"",&local_279);
  addr = md::ROM::inject_code(rom,(Code *)local_90,&local_278);
  Map::map_setup_addr((Map *)this,addr);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  md::Code::~Code((Code *)local_90);
  return;
}

Assistant:

static void add_func_reinforce_room_9_spikeballs(md::ROM& rom, Map* map)
{
    md::Code func_init_map;
    func_init_map.movem_to_stack({ reg_D0 }, { reg_A0 });
    {
        func_init_map.movel(map->entities().size()-1, reg_D0);
        func_init_map.lea(0xFF5500, reg_A0);
        func_init_map.label("loop_entities");
        {
            // Strengthen boulders
            func_init_map.moveb(0xA0, addr_(reg_A0, 0x3C)); // One shot
            func_init_map.adda(0x80, reg_A0);
        }
        func_init_map.dbra(reg_D0, "loop_entities");
    }
    func_init_map.movem_from_stack({ reg_D0 }, { reg_A0 });
    func_init_map.rts();

    map->map_setup_addr(rom.inject_code(func_init_map));
}